

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O3

void __thiscall
Adjacency_Subgraph_vertex_level_Test::TestBody(Adjacency_Subgraph_vertex_level_Test *this)

{
  AssertHelper AVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar5;
  long lVar6;
  StringLike<const_char_*> *regex;
  AssertHelper AVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  DeathTest *gtest_dt;
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  AssertHelper local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  int local_15c;
  undefined1 local_158 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_f0;
  Adjacency_Subgraph local_e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  Adjacency_Graph<false> local_60;
  
  Disa::create_graph_structured<false>(&local_60,3);
  vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000004;
  vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  local_158 = (undefined1  [8])0x1;
  vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000007;
  __l._M_len = 5;
  __l._M_array = (iterator)local_158;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_178,__l,(allocator_type *)&local_180);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph(&local_e0,&local_60,&local_178,0);
  if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_180.data_ = (AssertHelperData *)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level(&local_e0,(size_t *)&local_180);
  local_15c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level(0)","0",(unsigned_long *)&local_178,
             &local_15c);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_180.data_ = (AssertHelperData *)0x1;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level(&local_e0,(size_t *)&local_180);
  local_15c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level(1)","0",(unsigned_long *)&local_178,
             &local_15c);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_180.data_ = (AssertHelperData *)0x2;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level(&local_e0,(size_t *)&local_180);
  local_15c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level(2)","0",(unsigned_long *)&local_178,
             &local_15c);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_180.data_ = (AssertHelperData *)0x3;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level(&local_e0,(size_t *)&local_180);
  local_15c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level(3)","0",(unsigned_long *)&local_178,
             &local_15c);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_180.data_ = (AssertHelperData *)&DAT_00000004;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level(&local_e0,(size_t *)&local_180);
  local_15c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level(4)","0",(unsigned_long *)&local_178,
             &local_15c);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00177c38;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_180.data_ = (AssertHelperData *)&DAT_00000004;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_180;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_178,__l_00,(allocator_type *)&local_15c);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_158,&local_60,&local_178,0);
  local_e0.hash_parent = (size_t)local_158;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_e0.graph.vertex_adjacent_list,&vStack_150);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_e0.graph.offset,&local_138);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_e0.i_local_global,&local_120);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_e0.level_set_value,&local_108);
  p_Var8 = this_00 + 1;
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_158);
  if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_f0.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)p_Var8;
  local_f0.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = this_00;
  Disa::Adjacency_Subgraph::update_levels(&local_e0,&local_60,2,&local_f0);
  if (local_f0.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)p_Var8->_vptr__Sp_counted_base);
  local_180.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[0])","2",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x234,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 1));
  local_180.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[1])","1",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x235,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 2));
  local_180.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[2])","2",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x236,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 3));
  local_180.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[3])","1",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x237,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 4));
  local_180.data_ = local_180.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[4])","0",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x238,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 5));
  local_180.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[5])","1",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x239,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 6));
  local_180.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[6])","2",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 7));
  local_180.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[7])","1",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::vertex_level
                          (&local_e0,(size_t *)(p_Var8->_vptr__Sp_counted_base + 8));
  local_180.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"subgraph.vertex_level((*i_global_local)[8])","2",
             (unsigned_long *)&local_178,(int *)&local_180);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_178);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1596ac;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_158,
               (testing *)&local_178,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)local_158);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 vStack_150.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("subgraph.vertex_level(10) == 0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                       ,0x23d,(DeathTest **)&local_180);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    AVar7.data_ = local_180.data_;
    if (!bVar2) goto LAB_00120d07;
    if (local_180.data_ == (AssertHelperData *)0x0) goto LAB_00120d5d;
    iVar4 = (**(code **)(*(long *)local_180.data_ + 0x10))(local_180.data_);
    AVar1.data_ = local_180.data_;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_180.data_ + 0x18))(local_180.data_);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)AVar7.data_ + 8))(AVar7.data_);
        goto LAB_00120d07;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_158 = (undefined1  [8])&DAT_0000000a;
        Disa::Adjacency_Subgraph::vertex_level(&local_e0,(size_t *)local_158);
      }
      (**(code **)(*(long *)local_180.data_ + 0x28))(local_180.data_,2);
      (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
    }
    lVar6 = *(long *)AVar7.data_;
  }
  else {
LAB_00120d07:
    testing::Message::Message((Message *)local_158);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
    if (local_158 == (undefined1  [8])0x0) goto LAB_00120d5d;
    lVar6 = *(long *)local_158;
    AVar7.data_ = (AssertHelperData *)local_158;
  }
  (**(code **)(lVar6 + 8))(AVar7.data_);
LAB_00120d5d:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_e0);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_60);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, vertex_level) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);

  // Test local_global on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.vertex_level(1), 0);
  EXPECT_EQ(subgraph.vertex_level(2), 0);
  EXPECT_EQ(subgraph.vertex_level(3), 0);
  EXPECT_EQ(subgraph.vertex_level(4), 0);

  // Test local_global on both level and primary parts of the subgraph.
  std::shared_ptr<std::vector<std::size_t>> i_global_local = std::make_shared<std::vector<std::size_t>>();
  subgraph = Adjacency_Subgraph(graph, {4});
  subgraph.update_levels(graph, 2, i_global_local);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[0]), 2);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[1]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[2]), 2);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[3]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[4]), 0);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[5]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[6]), 2);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[7]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[8]), 2);
  EXPECT_DEATH(subgraph.vertex_level(10) == 0, "./*");
}